

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.h
# Opt level: O0

string * __thiscall Capital::operator()(Capital *this,string *s)

{
  byte bVar1;
  byte *pbVar2;
  ulong in_RDX;
  string *in_RDI;
  string local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  allocator local_39;
  string local_38 [32];
  ulong local_18;
  
  local_18 = in_RDX;
  pbVar2 = (byte *)std::__cxx11::string::operator[](in_RDX);
  bVar1 = *pbVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,1,bVar1 ^ 0x20,&local_39);
  std::__cxx11::string::substr((ulong)local_70,local_18);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return in_RDI;
}

Assistant:

const string operator()(const string& s) const {
    return string(1, s[0] ^ 32) + s.substr(1);
  }